

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__write(uv_stream_t *stream)

{
  uint *puVar1;
  uint uVar2;
  undefined1 *puVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  long *plVar10;
  int iVar11;
  ulong uVar12;
  iovec *__iovec;
  anon_union_64_2_d657c519 scratch;
  msghdr msg;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  msghdr local_68;
  
LAB_004c3101:
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x32d,"void uv__write(uv_stream_t *)");
  }
  puVar3 = (undefined1 *)stream->write_queue[0];
  if (stream->write_queue == (void **)puVar3) {
    return;
  }
  if (*(uv_stream_t **)(puVar3 + -8) != stream) {
    __assert_fail("req->handle == stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x334,"void uv__write(uv_stream_t *)");
  }
  iVar11 = *(int *)(puVar3 + 0x20) - *(uint *)(puVar3 + 0x10);
  __iovec = (iovec *)((ulong)*(uint *)(puVar3 + 0x10) * 0x10 + *(long *)(puVar3 + 0x18));
  iVar6 = uv__getiovmax();
  if (iVar6 <= iVar11) {
    iVar11 = iVar6;
  }
  lVar4 = *(long *)(puVar3 + -0x10);
  if (lVar4 != 0) {
    if ((*(byte *)(lVar4 + 0x58) & 3) == 0) {
      iVar6 = *(int *)(lVar4 + 0x10);
      lVar9 = 0xb8;
      if ((iVar6 != 7) && (iVar6 != 0xc)) {
        if (iVar6 != 0xf) goto LAB_004c33d4;
        lVar9 = 0xb0;
      }
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      uStack_90 = 0;
      if (-1 < (int)*(uint *)(lVar4 + lVar9)) {
        local_68.msg_name = (void *)0x0;
        local_68.msg_namelen = 0;
        local_68.msg_iovlen = (size_t)iVar11;
        local_68.msg_flags = 0;
        local_68.msg_controllen = 0x18;
        uStack_a0 = 0x100000001;
        local_a8 = 0x14;
        local_98 = (ulong)*(uint *)(lVar4 + lVar9);
        local_68.msg_iov = __iovec;
        local_68.msg_control = &local_a8;
LAB_004c31e6:
        uVar7 = sendmsg((stream->io_watcher).fd,&local_68,0);
        if (uVar7 == 0xffffffffffffffff) goto code_r0x004c31fc;
        if (-1 < (long)uVar7) {
          *(undefined8 *)(puVar3 + -0x10) = 0;
        }
LAB_004c325d:
        if (0 < (long)uVar7) {
          if (stream->write_queue_size < uVar7) {
            __assert_fail("n <= stream->write_queue_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x2e7,"int uv__write_req_update(uv_stream_t *, uv_write_t *, size_t)");
          }
          stream->write_queue_size = stream->write_queue_size - uVar7;
          lVar4 = *(long *)(puVar3 + 0x18);
          plVar10 = (long *)((ulong)*(uint *)(puVar3 + 0x10) * 0x10 + lVar4);
          do {
            uVar5 = plVar10[1];
            uVar12 = uVar5;
            if (uVar7 < uVar5) {
              uVar12 = uVar7;
            }
            *plVar10 = *plVar10 + uVar12;
            plVar10[1] = uVar5 - uVar12;
            plVar10 = plVar10 + (ulong)(uVar5 <= uVar7) * 2;
            uVar7 = uVar7 - uVar12;
          } while (uVar7 != 0);
          iVar11 = (int)((ulong)((long)plVar10 - lVar4) >> 4);
          *(int *)(puVar3 + 0x10) = iVar11;
          if (*(int *)(puVar3 + 0x20) == iVar11) {
            uv__write_req_finish((uv_write_t *)(puVar3 + -0x58));
            return;
          }
        }
        goto LAB_004c32c4;
      }
LAB_004c33d4:
      uStack_70 = 0;
      local_78 = 0;
      uStack_80 = 0;
      local_88 = 0;
      uStack_90 = 0;
      local_98 = 0;
      uStack_a0 = 0;
      local_a8 = 0;
      __assert_fail("fd_to_send >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x35b,"void uv__write(uv_stream_t *)");
    }
    iVar6 = -9;
    goto LAB_004c32ff;
  }
  do {
    iVar6 = (stream->io_watcher).fd;
    if (iVar11 == 1) {
      uVar7 = write(iVar6,__iovec->iov_base,__iovec->iov_len);
    }
    else {
      uVar7 = writev(iVar6,__iovec,iVar11);
    }
    if (uVar7 != 0xffffffffffffffff) goto LAB_004c325d;
    piVar8 = __errno_location();
    iVar6 = *piVar8;
  } while (iVar6 == 4);
  goto LAB_004c3241;
code_r0x004c31fc:
  piVar8 = __errno_location();
  if (*piVar8 != 4) goto code_r0x004c3206;
  goto LAB_004c31e6;
code_r0x004c3206:
  iVar6 = *piVar8;
LAB_004c3241:
  if ((iVar6 != 0xb) && (iVar6 != 0x69)) {
    iVar6 = -iVar6;
LAB_004c32ff:
    *(int *)(puVar3 + 0x24) = iVar6;
    uv__write_req_finish((uv_write_t *)(puVar3 + -0x58));
    uv__io_stop(stream->loop,&stream->io_watcher,4);
    iVar11 = uv__io_active(&stream->io_watcher,1);
    if (iVar11 != 0) {
      return;
    }
    uVar2 = stream->flags;
    if ((uVar2 & 4) == 0) {
      return;
    }
    stream->flags = uVar2 & 0xfffffffb;
    if ((uVar2 & 8) == 0) {
      return;
    }
    puVar1 = &stream->loop->active_handles;
    *puVar1 = *puVar1 - 1;
    return;
  }
LAB_004c32c4:
  if ((stream->flags & 0x100000) == 0) {
    uv__io_start(stream->loop,&stream->io_watcher,4);
    return;
  }
  goto LAB_004c3101;
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct iovec* iov;
  QUEUE* q;
  uv_write_t* req;
  int iovmax;
  int iovcnt;
  ssize_t n;
  int err;

start:

  assert(uv__stream_fd(stream) >= 0);

  if (QUEUE_EMPTY(&stream->write_queue))
    return;

  q = QUEUE_HEAD(&stream->write_queue);
  req = QUEUE_DATA(q, uv_write_t, queue);
  assert(req->handle == stream);

  /*
   * Cast to iovec. We had to have our own uv_buf_t instead of iovec
   * because Windows's WSABUF is not an iovec.
   */
  assert(sizeof(uv_buf_t) == sizeof(struct iovec));
  iov = (struct iovec*) &(req->bufs[req->write_index]);
  iovcnt = req->nbufs - req->write_index;

  iovmax = uv__getiovmax();

  /* Limit iov count to avoid EINVALs from writev() */
  if (iovcnt > iovmax)
    iovcnt = iovmax;

  /*
   * Now do the actual writev. Note that we've been updating the pointers
   * inside the iov each time we write. So there is no need to offset it.
   */

  if (req->send_handle) {
    int fd_to_send;
    struct msghdr msg;
    struct cmsghdr *cmsg;
    union {
      char data[64];
      struct cmsghdr alias;
    } scratch;

    if (uv__is_closing(req->send_handle)) {
      err = UV_EBADF;
      goto error;
    }

    fd_to_send = uv__handle_fd((uv_handle_t*) req->send_handle);

    memset(&scratch, 0, sizeof(scratch));

    assert(fd_to_send >= 0);

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = iov;
    msg.msg_iovlen = iovcnt;
    msg.msg_flags = 0;

    msg.msg_control = &scratch.alias;
    msg.msg_controllen = CMSG_SPACE(sizeof(fd_to_send));

    cmsg = CMSG_FIRSTHDR(&msg);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = CMSG_LEN(sizeof(fd_to_send));

    /* silence aliasing warning */
    {
      void* pv = CMSG_DATA(cmsg);
      int* pi = pv;
      *pi = fd_to_send;
    }

    do
      n = sendmsg(uv__stream_fd(stream), &msg, 0);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0)
      req->send_handle = NULL;
  } else {
    do
      n = uv__writev(uv__stream_fd(stream), iov, iovcnt);
    while (n == -1 && RETRY_ON_WRITE_ERROR(errno));
  }

  if (n == -1 && !IS_TRANSIENT_WRITE_ERROR(errno, req->send_handle)) {
    err = UV__ERR(errno);
    goto error;
  }

  if (n > 0 && uv__write_req_update(stream, req, n)) {
    uv__write_req_finish(req);
    return;  /* TODO(bnoordhuis) Start trying to write the next request. */
  }

  /* If this is a blocking stream, try again. */
  if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
    goto start;

  /* We're not done. */
  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

  /* Notify select() thread about state change */
  uv__stream_osx_interrupt_select(stream);

  return;

error:
  req->error = err;
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  if (!uv__io_active(&stream->io_watcher, POLLIN))
    uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
}